

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

int xe::getEnumValue(char *enumName,EnumMapEntry *entries,int numEntries,char *name)

{
  deUint32 dVar1;
  deBool dVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  dVar1 = deStringHash(name);
  if (0 < numEntries) {
    lVar5 = 0;
    do {
      if (*(deUint32 *)((long)&entries->hash + lVar5) == dVar1) {
        dVar2 = deStringEqual(*(char **)((long)&entries->name + lVar5),name);
        if (dVar2 != 0) {
          return *(int *)((long)&entries->value + lVar5);
        }
      }
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uint)numEntries * 0x18 != lVar5);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Could not map \'","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_b0 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_b0);
  *(undefined ***)this = &PTR__runtime_error_001373f0;
  __cxa_throw(this,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline int getEnumValue (const char* enumName, const EnumMapEntry* entries, int numEntries, const char* name)
{
	deUint32 hash = deStringHash(name);

	for (int ndx = 0; ndx < numEntries; ndx++)
	{
		if (entries[ndx].hash == hash && deStringEqual(entries[ndx].name, name))
			return entries[ndx].value;
	}

	throw TestResultParseError(string("Could not map '") + name + "' to " + enumName);
}